

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
node_handle_base<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::node_handle_base<std::basic_string_view<char,std::char_traits<char>>,int>
          (node_handle_base<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,undefined8 param_2,long *param_3,undefined4 *param_4)

{
  long lVar1;
  long lVar2;
  
  this[1] = (node_handle_base<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
             )0x1;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  lVar1 = param_3[1];
  lVar2 = *param_3;
  *(node_handle_base<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    **)(this + 8) = this + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(this + 8),lVar1,lVar2 + lVar1);
  *(undefined4 *)(this + 0x28) = *param_4;
  return;
}

Assistant:

node_handle_base(construct_tag_t, const allocator_type& a, Args&&... args)
      : alloc_(a) {
    PolicyTraits::construct(alloc(), slot(), std::forward<Args>(args)...);
  }